

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkLibs
          (cmMakefileTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *linkLibs,
          bool useResponseFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmMakefile *this_00;
  string *config;
  cmComputeLinkInformation *pcli;
  long lVar1;
  string link_rsp;
  string responseFlagVar;
  string linkPath;
  string frameworkPath;
  string local_50;
  
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&responseFlagVar,"CMAKE_BUILD_TYPE",(allocator<char> *)&link_rsp);
  config = cmMakefile::GetSafeDefinition(this_00,&responseFlagVar);
  std::__cxx11::string::~string((string *)&responseFlagVar);
  pcli = cmGeneratorTarget::GetLinkInformation
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  cmLocalGenerator::OutputLinkLibraries
            ((cmLocalGenerator *)this->LocalGenerator,pcli,linkLineComputer,linkLibs,&frameworkPath,
             &linkPath);
  std::operator+(&link_rsp,&frameworkPath,&linkPath);
  std::operator+(&responseFlagVar,&link_rsp,linkLibs);
  std::__cxx11::string::operator=((string *)linkLibs,(string *)&responseFlagVar);
  std::__cxx11::string::~string((string *)&responseFlagVar);
  std::__cxx11::string::~string((string *)&link_rsp);
  if ((useResponseFile) &&
     (lVar1 = std::__cxx11::string::find_first_not_of((char)linkLibs,0x20), lVar1 != -1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&responseFlagVar,"CMAKE_",(allocator<char> *)&link_rsp);
    cmGeneratorTarget::GetLinkerLanguage
              (&link_rsp,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &(this->super_cmCommonTargetGenerator).ConfigName);
    std::__cxx11::string::append((string *)&responseFlagVar);
    std::__cxx11::string::~string((string *)&link_rsp);
    std::__cxx11::string::append((char *)&responseFlagVar);
    cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&responseFlagVar);
    CreateResponseFile(&link_rsp,this,"linklibs.rsp",linkLibs,makefile_depends);
    std::__cxx11::string::assign((char *)linkLibs);
    cmOutputConverter::ConvertToOutputFormat
              (&local_50,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&link_rsp,SHELL);
    std::__cxx11::string::append((string *)linkLibs);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&link_rsp);
    std::__cxx11::string::~string((string *)&responseFlagVar);
  }
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkLibs(
  cmLinkLineComputer* linkLineComputer, std::string& linkLibs,
  bool useResponseFile, std::vector<std::string>& makefile_depends)
{
  std::string frameworkPath;
  std::string linkPath;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli =
    this->GeneratorTarget->GetLinkInformation(config);
  this->LocalGenerator->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                            frameworkPath, linkPath);
  linkLibs = frameworkPath + linkPath + linkLibs;

  if (useResponseFile &&
      linkLibs.find_first_not_of(' ') != std::string::npos) {
    // Lookup the response file reference flag.
    std::string responseFlagVar = "CMAKE_";
    responseFlagVar +=
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    responseFlagVar += "_RESPONSE_FILE_LINK_FLAG";
    const char* responseFlag = this->Makefile->GetDefinition(responseFlagVar);
    if (!responseFlag) {
      responseFlag = "@";
    }

    // Create this response file.
    std::string link_rsp =
      this->CreateResponseFile("linklibs.rsp", linkLibs, makefile_depends);

    // Reference the response file.
    linkLibs = responseFlag;
    linkLibs += this->LocalGenerator->ConvertToOutputFormat(
      link_rsp, cmOutputConverter::SHELL);
  }
}